

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

void ncnn::linear_coeffs(int w,int outw,int *xofs,float *alpha)

{
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  double dVar1;
  int sx;
  float fx;
  int dx;
  double scale;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    local_28 = ((float)local_24 + 0.5) * ((float)in_EDI / (float)in_ESI) - 0.5;
    dVar1 = std::floor((double)(ulong)(uint)local_28);
    local_2c = (int)SUB84(dVar1,0);
    local_28 = local_28 - (float)local_2c;
    if (local_2c < 0) {
      local_2c = 0;
      local_28 = 0.0;
    }
    if (in_EDI + -1 <= local_2c) {
      local_2c = in_EDI + -2;
      local_28 = 1.0;
    }
    *(int *)(in_RDX + (long)local_24 * 4) = local_2c;
    *(float *)(in_RCX + (long)(local_24 << 1) * 4) = 1.0 - local_28;
    *(float *)(in_RCX + (long)(local_24 * 2 + 1) * 4) = local_28;
  }
  return;
}

Assistant:

static void linear_coeffs(int w, int outw, int* xofs, float* alpha)
{
    double scale = (double)w / outw;

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        int sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx*2    ] = 1.f - fx;
        alpha[dx*2 + 1] = fx;
    }
}